

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stb.h
# Opt level: O0

char * stb_trimwhite(char *s)

{
  int iVar1;
  char *__s;
  size_t sVar2;
  ushort **ppuVar3;
  int local_14;
  int n;
  int i;
  char *s_local;
  
  __s = stb_skipwhite(s);
  sVar2 = strlen(__s);
  local_14 = (int)sVar2;
  do {
    iVar1 = local_14;
    local_14 = iVar1 + -1;
    if (local_14 < 0) break;
    ppuVar3 = __ctype_b_loc();
  } while (((*ppuVar3)[(int)__s[local_14]] & 0x2000) != 0);
  __s[iVar1] = '\0';
  return __s;
}

Assistant:

char *stb_trimwhite(char *s)
{
   int i,n;
   s = stb_skipwhite(s);
   n = (int) strlen(s);
   for (i=n-1; i >= 0; --i)
      if (!isspace(s[i]))
         break;
   s[i+1] = 0;
   return s;
}